

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  byte bVar1;
  char *pcVar2;
  WhereTerm *pWVar3;
  WhereTerm *pWVar4;
  sqlite3 *psVar5;
  u16 uVar6;
  int iVar7;
  Bitmask BVar8;
  Expr *pEVar9;
  Bitmask BVar10;
  Expr *pEVar11;
  Expr *pRight_00;
  ulong uVar12;
  WhereTerm *pNewTerm_1;
  int idxNew_5;
  Expr *pLeft_4;
  Expr *pNewExpr_2;
  int idxNew_4;
  int i_3;
  Expr *pRight_2;
  Expr *pLeft_3;
  Expr *pNew_1;
  int idxNew_3;
  int i_2;
  Expr *t;
  Expr *pNewExpr_1;
  Bitmask prereqExpr;
  Bitmask prereqColumn;
  WhereTerm *pNewTerm;
  int idxNew_2;
  int res;
  Expr *pLeft_2;
  Expr *pRight_1;
  u8 *pC;
  int local_120;
  u8 c_1;
  char c;
  int i_1;
  u16 wtFlags;
  char *zCollSeqName;
  int idxNew2;
  int idxNew1;
  Expr *pNewExpr2;
  Expr *pNewExpr1;
  Expr *pStr2;
  Expr *pLeft_1;
  Expr *pEStack_e0;
  int idxNew_1;
  Expr *pNewExpr;
  long lStack_d0;
  int i;
  ExprList *pList;
  int idxNew;
  u16 eExtraOp;
  Expr *pDup;
  WhereTerm *pNew;
  Expr *pEStack_a8;
  u16 opMask;
  Expr *pRight;
  Expr *pLeft;
  int aiCurCol [2];
  Bitmask x;
  int nLeft;
  uchar eOp2;
  sqlite3 *db;
  Parse *pParse;
  int local_68;
  int op;
  int noCase;
  int isComplete;
  Expr *pStr1;
  Bitmask extraRight;
  Bitmask prereqAll;
  Bitmask prereqLeft;
  Expr *pExpr;
  WhereMaskSet *pMaskSet;
  WhereTerm *pTerm;
  WhereInfo *pWInfo;
  WhereClause *pWStack_18;
  int idxTerm_local;
  WhereClause *pWC_local;
  SrcList *pSrc_local;
  
  pTerm = (WhereTerm *)pWC->pWInfo;
  pStr1 = (Expr *)0x0;
  _noCase = (Expr *)0x0;
  op = 0;
  local_68 = 0;
  db = (sqlite3 *)((WhereInfo *)pTerm)->pParse;
  _nLeft = (sqlite3 *)db->pVfs;
  x._7_1_ = '\0';
  if (_nLeft->mallocFailed != '\0') {
    return;
  }
  pMaskSet = (WhereMaskSet *)(pWC->a + idxTerm);
  pExpr = (Expr *)&((WhereInfo *)pTerm)->sMaskSet;
  prereqLeft = *(Bitmask *)pMaskSet;
  pWInfo._4_4_ = idxTerm;
  pWStack_18 = pWC;
  pWC_local = (WhereClause *)pSrc;
  prereqAll = sqlite3WhereExprUsage((WhereMaskSet *)pExpr,*(Expr **)(prereqLeft + 0x10));
  pParse._4_4_ = (uint)*(byte *)prereqLeft;
  if (pParse._4_4_ == 0x31) {
    iVar7 = sqlite3ExprCheckIN((Parse *)db,(Expr *)prereqLeft);
    if (iVar7 != 0) {
      return;
    }
    if ((*(uint *)(prereqLeft + 4) & 0x800) == 0) {
      BVar8 = sqlite3WhereExprListUsage((WhereMaskSet *)pExpr,*(ExprList **)(prereqLeft + 0x20));
      *(Bitmask *)(pMaskSet->ix + 10) = BVar8;
    }
    else {
      BVar8 = exprSelectUsage((WhereMaskSet *)pExpr,*(Select **)(prereqLeft + 0x20));
      *(Bitmask *)(pMaskSet->ix + 10) = BVar8;
    }
  }
  else if (pParse._4_4_ == 0x32) {
    pMaskSet->ix[10] = 0;
    pMaskSet->ix[0xb] = 0;
  }
  else {
    BVar8 = sqlite3WhereExprUsage((WhereMaskSet *)pExpr,*(Expr **)(prereqLeft + 0x18));
    *(Bitmask *)(pMaskSet->ix + 10) = BVar8;
  }
  pExpr->op = '\0';
  pExpr->affinity = '\0';
  *(undefined2 *)&pExpr->field_0x2 = 0;
  extraRight = sqlite3WhereExprUsageNN((WhereMaskSet *)pExpr,(Expr *)prereqLeft);
  iVar7._0_1_ = pExpr->op;
  iVar7._1_1_ = pExpr->affinity;
  iVar7._2_2_ = *(undefined2 *)&pExpr->field_0x2;
  if (iVar7 != 0) {
    *(ushort *)((long)pMaskSet->ix + 10) = *(ushort *)((long)pMaskSet->ix + 10) | 0x1000;
  }
  if ((*(uint *)(prereqLeft + 4) & 1) != 0) {
    aiCurCol = (int  [2])
               sqlite3WhereGetMask((WhereMaskSet *)pExpr,(int)*(short *)(prereqLeft + 0x34));
    extraRight = (ulong)aiCurCol | extraRight;
    pStr1 = (Expr *)((long)aiCurCol - 1);
    if ((ulong)aiCurCol <= extraRight >> 1) {
      sqlite3ErrorMsg((Parse *)db,"ON clause references tables to its right");
      return;
    }
  }
  *(Bitmask *)(pMaskSet->ix + 0xc) = extraRight;
  pMaskSet->ix[5] = -1;
  pMaskSet->ix[4] = -1;
  *(undefined2 *)(pMaskSet->ix + 3) = 0;
  iVar7 = allowedOp(pParse._4_4_);
  if (iVar7 == 0) {
    if ((*(char *)prereqLeft == '0') && (pWStack_18->op == ',')) {
      lStack_d0 = *(long *)(prereqLeft + 0x20);
      for (pNewExpr._4_4_ = 0; psVar5 = db, pNewExpr._4_4_ < 2; pNewExpr._4_4_ = pNewExpr._4_4_ + 1)
      {
        bVar1 = "97"[pNewExpr._4_4_];
        pEVar9 = sqlite3ExprDup(_nLeft,*(Expr **)(prereqLeft + 0x10),0);
        pEVar11 = sqlite3ExprDup(_nLeft,*(Expr **)(lStack_d0 + 8 + (long)pNewExpr._4_4_ * 0x20),0);
        pEStack_e0 = sqlite3PExpr((Parse *)psVar5,(uint)bVar1,pEVar9,pEVar11);
        transferJoinMarkings(pEStack_e0,(Expr *)prereqLeft);
        pLeft_1._4_4_ = whereClauseInsert(pWStack_18,pEStack_e0,3);
        exprAnalyze((SrcList *)pWC_local,pWStack_18,pLeft_1._4_4_);
        pMaskSet = (WhereMaskSet *)(pWStack_18->a + pWInfo._4_4_);
        markTermAsChild(pWStack_18,pLeft_1._4_4_,pWInfo._4_4_);
      }
    }
    else if (*(char *)prereqLeft == '+') {
      exprAnalyzeOrTerm((SrcList *)pWC_local,pWStack_18,pWInfo._4_4_);
      pMaskSet = (WhereMaskSet *)(pWStack_18->a + pWInfo._4_4_);
    }
  }
  else {
    pRight = sqlite3ExprSkipCollate(*(Expr **)(prereqLeft + 0x10));
    pEStack_a8 = sqlite3ExprSkipCollate(*(Expr **)(prereqLeft + 0x18));
    pNew._6_2_ = 0x800;
    if ((*(ulong *)(pMaskSet->ix + 10) & prereqAll) == 0) {
      pNew._6_2_ = 0x1fff;
    }
    if (0 < pMaskSet->ix[6]) {
      pRight = ((pRight->x).pList)->a[pMaskSet->ix[6] + -1].pExpr;
    }
    iVar7 = exprMightBeIndexed((SrcList *)pWC_local,prereqAll,(int *)&pLeft,pRight,pParse._4_4_);
    if (iVar7 != 0) {
      pMaskSet->ix[5] = (int)pLeft;
      pMaskSet->ix[8] = pLeft._4_4_;
      uVar6 = operatorMask(pParse._4_4_);
      *(u16 *)(pMaskSet->ix + 3) = uVar6 & pNew._6_2_;
    }
    if (pParse._4_4_ == 0x2d) {
      *(ushort *)((long)pMaskSet->ix + 10) = *(ushort *)((long)pMaskSet->ix + 10) | 0x800;
    }
    if ((pEStack_a8 != (Expr *)0x0) &&
       (iVar7 = exprMightBeIndexed((SrcList *)pWC_local,*(Bitmask *)(pMaskSet->ix + 10),
                                   (int *)&pLeft,pEStack_a8,pParse._4_4_), iVar7 != 0)) {
      pList._6_2_ = 0;
      if (pMaskSet->ix[5] < 0) {
        _idxNew = (Expr *)prereqLeft;
        pDup = (Expr *)pMaskSet;
      }
      else {
        _idxNew = sqlite3ExprDup(_nLeft,(Expr *)prereqLeft,0);
        if (_nLeft->mallocFailed != '\0') {
          sqlite3ExprDelete(_nLeft,_idxNew);
          return;
        }
        pList._0_4_ = whereClauseInsert(pWStack_18,_idxNew,3);
        if ((int)pList == 0) {
          return;
        }
        pDup = (Expr *)(pWStack_18->a + (int)pList);
        markTermAsChild(pWStack_18,(int)pList,pWInfo._4_4_);
        if (pParse._4_4_ == 0x2d) {
          *(ushort *)((long)&pDup->pLeft + 2) = *(ushort *)((long)&pDup->pLeft + 2) | 0x800;
        }
        pMaskSet = (WhereMaskSet *)(pWStack_18->a + pWInfo._4_4_);
        *(ushort *)((long)pMaskSet->ix + 10) = *(ushort *)((long)pMaskSet->ix + 10) | 8;
        iVar7 = termIsEquivalence((Parse *)db,_idxNew);
        if (iVar7 != 0) {
          *(ushort *)(pMaskSet->ix + 3) = (ushort)pMaskSet->ix[3] | 0x800;
          pList._6_2_ = 0x800;
        }
      }
      exprCommute((Parse *)db,_idxNew);
      *(int *)((long)&pDup->pRight + 4) = (int)pLeft;
      pDup->nHeight = pLeft._4_4_;
      uVar12 = prereqAll | (ulong)pStr1;
      pDup->iColumn = (short)uVar12;
      pDup->iAgg = (short)(uVar12 >> 0x10);
      pDup->iRightJoinTable = (short)(uVar12 >> 0x20);
      pDup->op2 = (char)(uVar12 >> 0x30);
      pDup->field_0x37 = (char)(uVar12 >> 0x38);
      pDup->pAggInfo = (AggInfo *)extraRight;
      uVar6 = operatorMask((uint)_idxNew->op);
      *(u16 *)((long)&pDup->pLeft + 4) = uVar6 + pList._6_2_ & pNew._6_2_;
    }
  }
  if ((pWStack_18->op == ',') &&
     (iVar7 = isLikeOrGlob((Parse *)db,(Expr *)prereqLeft,(Expr **)&noCase,&op,&local_68),
     iVar7 != 0)) {
    _c_1 = 0x103;
    pStr2 = *(Expr **)(*(long *)(prereqLeft + 0x20) + 0x28);
    pNewExpr1 = sqlite3ExprDup(_nLeft,_noCase,0);
    if ((local_68 != 0) && (*(char *)((long)&db->pVfs->xDlClose + 1) == '\0')) {
      *(ushort *)((long)pMaskSet->ix + 10) = *(ushort *)((long)pMaskSet->ix + 10) | 0x400;
      for (local_120 = 0; bVar1 = (_noCase->u).zToken[local_120], bVar1 != 0;
          local_120 = local_120 + 1) {
        (_noCase->u).zToken[local_120] = bVar1 & (""[bVar1] & 0x20 ^ 0xff);
        (pNewExpr1->u).zToken[local_120] = ""[bVar1];
      }
      pC._7_1_ = 0;
    }
    if (_nLeft->mallocFailed == '\0') {
      pcVar2 = (pNewExpr1->u).zToken;
      iVar7 = sqlite3Strlen30((pNewExpr1->u).zToken);
      pRight_1 = (Expr *)(pcVar2 + (iVar7 + -1));
      pC._6_1_ = pRight_1->op;
      if (local_68 != 0) {
        if (pC._6_1_ == 0x40) {
          op = 0;
        }
        pC._6_1_ = ""[pC._6_1_];
      }
      pRight_1->op = pC._6_1_ + 1;
    }
    _i_1 = "BINARY";
    if (local_68 != 0) {
      _i_1 = "NOCASE";
    }
    pNewExpr2 = sqlite3ExprDup(_nLeft,pStr2,0);
    psVar5 = db;
    pEVar9 = sqlite3ExprAddCollateString((Parse *)db,pNewExpr2,_i_1);
    pNewExpr2 = sqlite3PExpr((Parse *)psVar5,0x39,pEVar9,_noCase);
    transferJoinMarkings(pNewExpr2,(Expr *)prereqLeft);
    zCollSeqName._4_4_ = whereClauseInsert(pWStack_18,pNewExpr2,0x103);
    exprAnalyze((SrcList *)pWC_local,pWStack_18,zCollSeqName._4_4_);
    _idxNew2 = sqlite3ExprDup(_nLeft,pStr2,0);
    psVar5 = db;
    pEVar9 = sqlite3ExprAddCollateString((Parse *)db,_idxNew2,_i_1);
    _idxNew2 = sqlite3PExpr((Parse *)psVar5,0x38,pEVar9,pNewExpr1);
    transferJoinMarkings(_idxNew2,(Expr *)prereqLeft);
    zCollSeqName._0_4_ = whereClauseInsert(pWStack_18,_idxNew2,0x103);
    exprAnalyze((SrcList *)pWC_local,pWStack_18,(int)zCollSeqName);
    pMaskSet = (WhereMaskSet *)(pWStack_18->a + pWInfo._4_4_);
    if (op != 0) {
      markTermAsChild(pWStack_18,zCollSeqName._4_4_,pWInfo._4_4_);
      markTermAsChild(pWStack_18,(int)zCollSeqName,pWInfo._4_4_);
    }
  }
  if (pWStack_18->op == ',') {
    pLeft_2 = (Expr *)0x0;
    _idxNew_2 = (Expr *)0x0;
    pNewTerm._4_4_ =
         isAuxiliaryVtabOperator
                   (_nLeft,(Expr *)prereqLeft,(uchar *)((long)&x + 7),(Expr **)&idxNew_2,&pLeft_2);
    while (0 < pNewTerm._4_4_) {
      BVar8 = sqlite3WhereExprUsage((WhereMaskSet *)pExpr,pLeft_2);
      BVar10 = sqlite3WhereExprUsage((WhereMaskSet *)pExpr,_idxNew_2);
      psVar5 = db;
      if ((BVar8 & BVar10) == 0) {
        pEVar9 = sqlite3ExprDup(_nLeft,pLeft_2,0);
        pEVar9 = sqlite3PExpr((Parse *)psVar5,0x2e,(Expr *)0x0,pEVar9);
        if (((*(uint *)(prereqLeft + 4) & 1) != 0) && (pEVar9 != (Expr *)0x0)) {
          pEVar9->flags = pEVar9->flags | 1;
        }
        iVar7 = whereClauseInsert(pWStack_18,pEVar9,3);
        pWVar3 = pWStack_18->a;
        pWVar3[iVar7].prereqRight = BVar8;
        pWVar3[iVar7].leftCursor = _idxNew_2->iTable;
        *(int *)&pWVar3[iVar7].u = (int)_idxNew_2->iColumn;
        pWVar3[iVar7].eOperator = 0x40;
        pWVar3[iVar7].eMatchOp = x._7_1_;
        markTermAsChild(pWStack_18,iVar7,pWInfo._4_4_);
        pMaskSet = (WhereMaskSet *)(pWStack_18->a + pWInfo._4_4_);
        *(ushort *)((long)pMaskSet->ix + 10) = *(ushort *)((long)pMaskSet->ix + 10) | 8;
        pWVar3[iVar7].prereqAll = *(Bitmask *)(pMaskSet->ix + 0xc);
      }
      pEVar9 = pLeft_2;
      pLeft_2 = _idxNew_2;
      pNewTerm._4_4_ = pNewTerm._4_4_ + -1;
      _idxNew_2 = pEVar9;
    }
  }
  if ((((pWStack_18->op == ',') &&
       (((*(char *)prereqLeft == '5' || (*(char *)prereqLeft == '-')) &&
        (x._0_4_ = sqlite3ExprVectorSize(*(Expr **)(prereqLeft + 0x10)), 1 < (int)x)))) &&
      (iVar7 = sqlite3ExprVectorSize(*(Expr **)(prereqLeft + 0x18)), iVar7 == (int)x)) &&
     (((*(uint *)(*(long *)(prereqLeft + 0x10) + 4) & 0x800) == 0 ||
      ((*(uint *)(*(long *)(prereqLeft + 0x18) + 4) & 0x800) == 0)))) {
    for (pNew_1._4_4_ = 0; pNew_1._4_4_ < (int)x; pNew_1._4_4_ = pNew_1._4_4_ + 1) {
      pEVar9 = sqlite3ExprForVectorField((Parse *)db,*(Expr **)(prereqLeft + 0x10),pNew_1._4_4_);
      pEVar11 = sqlite3ExprForVectorField((Parse *)db,*(Expr **)(prereqLeft + 0x18),pNew_1._4_4_);
      pEVar9 = sqlite3PExpr((Parse *)db,(uint)*(byte *)prereqLeft,pEVar9,pEVar11);
      transferJoinMarkings(pEVar9,(Expr *)prereqLeft);
      iVar7 = whereClauseInsert(pWStack_18,pEVar9,1);
      exprAnalyze((SrcList *)pWC_local,pWStack_18,iVar7);
    }
    pMaskSet = (WhereMaskSet *)(pWStack_18->a + pWInfo._4_4_);
    *(ushort *)((long)pMaskSet->ix + 10) = *(ushort *)((long)pMaskSet->ix + 10) | 6;
    *(undefined2 *)(pMaskSet->ix + 3) = 0;
  }
  if (((pWStack_18->op == ',') && (*(char *)prereqLeft == '1')) &&
     ((pMaskSet->ix[6] == 0 &&
      ((**(char **)(prereqLeft + 0x10) == -0x57 &&
       (*(long *)(*(long *)(prereqLeft + 0x20) + 0x50) == 0)))))) {
    for (pNewExpr_2._4_4_ = 0; iVar7 = sqlite3ExprVectorSize(*(Expr **)(prereqLeft + 0x10)),
        pNewExpr_2._4_4_ < iVar7; pNewExpr_2._4_4_ = pNewExpr_2._4_4_ + 1) {
      iVar7 = whereClauseInsert(pWStack_18,(Expr *)prereqLeft,2);
      pWStack_18->a[iVar7].iField = pNewExpr_2._4_4_ + 1;
      exprAnalyze((SrcList *)pWC_local,pWStack_18,iVar7);
      markTermAsChild(pWStack_18,iVar7,pWInfo._4_4_);
    }
  }
  psVar5 = db;
  if ((((*(char *)prereqLeft == '3') && (**(char **)(prereqLeft + 0x10) == -0x5e)) &&
      (-1 < *(short *)(*(long *)(prereqLeft + 0x10) + 0x30))) &&
     (((*(uint *)(prereqLeft + 4) & 1) == 0 && ((_nLeft->dbOptFlags & 0x800) == 0)))) {
    pEVar9 = *(Expr **)(prereqLeft + 0x10);
    pEVar11 = sqlite3ExprDup(_nLeft,pEVar9,0);
    pRight_00 = sqlite3ExprAlloc(_nLeft,0x72,(Token *)0x0,0);
    pEVar11 = sqlite3PExpr((Parse *)psVar5,0x36,pEVar11,pRight_00);
    iVar7 = whereClauseInsert(pWStack_18,pEVar11,0x83);
    if (iVar7 != 0) {
      pWVar3 = pWStack_18->a;
      pWVar3[iVar7].prereqRight = 0;
      pWVar3[iVar7].leftCursor = pEVar9->iTable;
      *(int *)&pWVar3[iVar7].u = (int)pEVar9->iColumn;
      pWVar3[iVar7].eOperator = 4;
      markTermAsChild(pWStack_18,iVar7,pWInfo._4_4_);
      pWVar4 = pWStack_18->a;
      pWVar4[pWInfo._4_4_].wtFlags = pWVar4[pWInfo._4_4_].wtFlags | 8;
      pWVar3[iVar7].prereqAll = pWVar4[pWInfo._4_4_].prereqAll;
    }
  }
  pWStack_18->a[pWInfo._4_4_].prereqRight = (ulong)pStr1 | pWStack_18->a[pWInfo._4_4_].prereqRight;
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo; /* WHERE clause processing context */
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* uppercase equivalent to lowercase */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWInfo->pParse;  /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */
  unsigned char eOp2 = 0;          /* op2 value for LIKE/REGEXP/GLOB */
  int nLeft;                       /* Number of elements on left side vector */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = &pWInfo->sMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = sqlite3WhereExprUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = sqlite3WhereExprListUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = sqlite3WhereExprUsage(pMaskSet, pExpr->pRight);
  }
  pMaskSet->bVarSelect = 0;
  prereqAll = sqlite3WhereExprUsageNN(pMaskSet, pExpr);
  if( pMaskSet->bVarSelect ) pTerm->wtFlags |= TERM_VARSELECT;
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = sqlite3WhereGetMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
    if( (prereqAll>>1)>=x ){
      sqlite3ErrorMsg(pParse, "ON clause references tables to its right");
      return;
    }
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    int aiCurCol[2];
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;

    if( pTerm->iField>0 ){
      assert( op==TK_IN );
      assert( pLeft->op==TK_VECTOR );
      pLeft = pLeft->x.pList->a[pTerm->iField-1].pExpr;
    }

    if( exprMightBeIndexed(pSrc, prereqLeft, aiCurCol, pLeft, op) ){
      pTerm->leftCursor = aiCurCol[0];
      pTerm->u.leftColumn = aiCurCol[1];
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( op==TK_IS ) pTerm->wtFlags |= TERM_IS;
    if( pRight 
     && exprMightBeIndexed(pSrc, pTerm->prereqRight, aiCurCol, pRight, op)
    ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      assert( pTerm->iField==0 );
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        markTermAsChild(pWC, idxNew, idxTerm);
        if( op==TK_IS ) pNew->wtFlags |= TERM_IS;
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;

        if( termIsEquivalence(pParse, pDup) ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pNew->leftCursor = aiCurCol[0];
      pNew->u.leftColumn = aiCurCol[1];
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0));
      transferJoinMarkings(pNewExpr, pExpr);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'aBc%'" is changed into constraints
  **
  **          x>='ABC' AND x<'abd' AND x LIKE 'aBc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".  If case is not significant (the default
  ** for LIKE) then the lower-bound is made all uppercase and the upper-
  ** bound is made all lowercase so that the bounds also work when comparing
  ** BLOBs.
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    const char *zCollSeqName;     /* Name of collating sequence */
    const u16 wtFlags = TERM_LIKEOPT | TERM_VIRTUAL | TERM_DYNAMIC;

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);

    /* Convert the lower bound to upper-case and the upper bound to
    ** lower-case (upper-case is less than lower-case in ASCII) so that
    ** the range constraints also work for BLOBs
    */
    if( noCase && !pParse->db->mallocFailed ){
      int i;
      char c;
      pTerm->wtFlags |= TERM_LIKE;
      for(i=0; (c = pStr1->u.zToken[i])!=0; i++){
        pStr1->u.zToken[i] = sqlite3Toupper(c);
        pStr2->u.zToken[i] = sqlite3Tolower(c);
      }
    }

    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;
        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    zCollSeqName = noCase ? "NOCASE" : sqlite3StrBINARY;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE,
           sqlite3ExprAddCollateString(pParse,pNewExpr1,zCollSeqName),
           pStr1);
    transferJoinMarkings(pNewExpr1, pExpr);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, wtFlags);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateString(pParse,pNewExpr2,zCollSeqName),
           pStr2);
    transferJoinMarkings(pNewExpr2, pExpr);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, wtFlags);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      markTermAsChild(pWC, idxNew1, idxTerm);
      markTermAsChild(pWC, idxNew2, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_AUX auxiliary term to the constraint set if the
  ** current expression is of the form "column OP expr" where OP
  ** is an operator that gets passed into virtual tables but which is
  ** not normally optimized for ordinary tables.  In other words, OP
  ** is one of MATCH, LIKE, GLOB, REGEXP, !=, IS, IS NOT, or NOT NULL.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( pWC->op==TK_AND ){
    Expr *pRight = 0, *pLeft = 0;
    int res = isAuxiliaryVtabOperator(db, pExpr, &eOp2, &pLeft, &pRight);
    while( res-- > 0 ){
      int idxNew;
      WhereTerm *pNewTerm;
      Bitmask prereqColumn, prereqExpr;

      prereqExpr = sqlite3WhereExprUsage(pMaskSet, pRight);
      prereqColumn = sqlite3WhereExprUsage(pMaskSet, pLeft);
      if( (prereqExpr & prereqColumn)==0 ){
        Expr *pNewExpr;
        pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
            0, sqlite3ExprDup(db, pRight, 0));
        if( ExprHasProperty(pExpr, EP_FromJoin) && pNewExpr ){
          ExprSetProperty(pNewExpr, EP_FromJoin);
        }
        idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        pNewTerm = &pWC->a[idxNew];
        pNewTerm->prereqRight = prereqExpr;
        pNewTerm->leftCursor = pLeft->iTable;
        pNewTerm->u.leftColumn = pLeft->iColumn;
        pNewTerm->eOperator = WO_AUX;
        pNewTerm->eMatchOp = eOp2;
        markTermAsChild(pWC, idxNew, idxTerm);
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;
        pNewTerm->prereqAll = pTerm->prereqAll;
      }
      SWAP(Expr*, pLeft, pRight);
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

  /* If there is a vector == or IS term - e.g. "(a, b) == (?, ?)" - create
  ** new terms for each component comparison - "a = ?" and "b = ?".  The
  ** new terms completely replace the original vector comparison, which is
  ** no longer used.
  **
  ** This is only required if at least one side of the comparison operation
  ** is not a sub-select.  */
  if( pWC->op==TK_AND 
  && (pExpr->op==TK_EQ || pExpr->op==TK_IS)
  && (nLeft = sqlite3ExprVectorSize(pExpr->pLeft))>1
  && sqlite3ExprVectorSize(pExpr->pRight)==nLeft
  && ( (pExpr->pLeft->flags & EP_xIsSelect)==0 
    || (pExpr->pRight->flags & EP_xIsSelect)==0)
  ){
    int i;
    for(i=0; i<nLeft; i++){
      int idxNew;
      Expr *pNew;
      Expr *pLeft = sqlite3ExprForVectorField(pParse, pExpr->pLeft, i);
      Expr *pRight = sqlite3ExprForVectorField(pParse, pExpr->pRight, i);

      pNew = sqlite3PExpr(pParse, pExpr->op, pLeft, pRight);
      transferJoinMarkings(pNew, pExpr);
      idxNew = whereClauseInsert(pWC, pNew, TERM_DYNAMIC);
      exprAnalyze(pSrc, pWC, idxNew);
    }
    pTerm = &pWC->a[idxTerm];
    pTerm->wtFlags |= TERM_CODED|TERM_VIRTUAL;  /* Disable the original */
    pTerm->eOperator = 0;
  }

  /* If there is a vector IN term - e.g. "(a, b) IN (SELECT ...)" - create
  ** a virtual term for each vector component. The expression object
  ** used by each such virtual term is pExpr (the full vector IN(...) 
  ** expression). The WhereTerm.iField variable identifies the index within
  ** the vector on the LHS that the virtual term represents.
  **
  ** This only works if the RHS is a simple SELECT, not a compound
  */
  if( pWC->op==TK_AND && pExpr->op==TK_IN && pTerm->iField==0
   && pExpr->pLeft->op==TK_VECTOR
   && pExpr->x.pSelect->pPrior==0
  ){
    int i;
    for(i=0; i<sqlite3ExprVectorSize(pExpr->pLeft); i++){
      int idxNew;
      idxNew = whereClauseInsert(pWC, pExpr, TERM_VIRTUAL);
      pWC->a[idxNew].iField = i+1;
      exprAnalyze(pSrc, pWC, idxNew);
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }

#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
   && !ExprHasProperty(pExpr, EP_FromJoin)
   && OptimizationEnabled(db, SQLITE_Stat34)
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3ExprAlloc(db, TK_NULL, 0, 0));

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      markTermAsChild(pWC, idxNew, idxTerm);
      pTerm = &pWC->a[idxTerm];
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  testcase( pTerm!=&pWC->a[idxTerm] );
  pTerm = &pWC->a[idxTerm];
  pTerm->prereqRight |= extraRight;
}